

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O2

type __thiscall
llvm::make_unique<llbuild::buildsystem::Target,std::__cxx11::string&>
          (llvm *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  Target *this_00;
  string local_40;
  
  this_00 = (Target *)operator_new(0x38);
  std::__cxx11::string::string((string *)&local_40,(string *)args);
  llbuild::buildsystem::Target::Target(this_00,&local_40);
  *(Target **)this = this_00;
  std::__cxx11::string::_M_dispose();
  return (__uniq_ptr_data<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>,_true,_true>
            )this;
}

Assistant:

typename std::enable_if<!std::is_array<T>::value, std::unique_ptr<T>>::type
make_unique(Args &&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}